

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O1

void __thiscall irr::scene::CSkinnedMesh::resetAnimation(CSkinnedMesh *this)

{
  ushort uVar1;
  undefined4 uVar2;
  SJoint *pSVar3;
  SSkinMeshBuffer *pSVar4;
  pointer ppSVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  ppSVar5 = (this->AllJoints).m_data.
            super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->AllJoints).m_data.
                          super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5) >> 3) != 0) {
    uVar8 = 0;
    do {
      pSVar3 = ppSVar5[uVar8];
      lVar11 = *(long *)&(pSVar3->Weights).m_data.
                         super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
      ;
      if ((int)((ulong)((long)*(pointer *)((long)&(pSVar3->Weights).m_data + 8) - lVar11) >> 4) *
          -0x55555555 != 0) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          uVar1 = *(ushort *)(lVar11 + lVar9);
          uVar2 = *(undefined4 *)(lVar11 + 4 + lVar9);
          puVar6 = (undefined8 *)
                   (**(code **)((long)((this->LocalBuffers).m_data.
                                       super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar1]->
                                      super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))();
          *puVar6 = *(undefined8 *)(lVar11 + 0x18 + lVar9);
          *(undefined4 *)(puVar6 + 1) = *(undefined4 *)(lVar11 + 0x20 + lVar9);
          lVar11 = *(long *)&(pSVar3->Weights).m_data.
                             super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
          ;
          pSVar4 = (this->LocalBuffers).m_data.
                   super__Vector_base<irr::scene::SSkinMeshBuffer_*,_std::allocator<irr::scene::SSkinMeshBuffer_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar1];
          lVar7 = (**(code **)((long)(pSVar4->super_IMeshBuffer)._vptr_IMeshBuffer + 0x108))
                            (pSVar4,uVar2);
          *(undefined4 *)(lVar7 + 0x14) = *(undefined4 *)(lVar11 + 0x2c + lVar9);
          *(undefined8 *)(lVar7 + 0xc) = *(undefined8 *)(lVar11 + 0x24 + lVar9);
          uVar10 = uVar10 + 1;
          lVar11 = *(long *)&(pSVar3->Weights).m_data.
                             super__Vector_base<irr::scene::ISkinnedMesh::SWeight,_std::allocator<irr::scene::ISkinnedMesh::SWeight>_>
          ;
          lVar9 = lVar9 + 0x30;
        } while (uVar10 < (uint)((int)((ulong)((long)*(pointer *)
                                                      ((long)&(pSVar3->Weights).m_data + 8) - lVar11
                                              ) >> 4) * -0x55555555));
      }
      uVar8 = uVar8 + 1;
      ppSVar5 = (this->AllJoints).m_data.
                super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < ((ulong)((long)(this->AllJoints).m_data.
                                    super__Vector_base<irr::scene::ISkinnedMesh::SJoint_*,_std::allocator<irr::scene::ISkinnedMesh::SJoint_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar5) >> 3
                     & 0xffffffff));
  }
  this->SkinnedLastFrame = false;
  this->LastAnimatedFrame = -1.0;
  return;
}

Assistant:

void CSkinnedMesh::resetAnimation()
{
	// copy from the cache to the mesh...
	for (u32 i = 0; i < AllJoints.size(); ++i) {
		SJoint *joint = AllJoints[i];
		for (u32 j = 0; j < joint->Weights.size(); ++j) {
			const u16 buffer_id = joint->Weights[j].buffer_id;
			const u32 vertex_id = joint->Weights[j].vertex_id;
			LocalBuffers[buffer_id]->getVertex(vertex_id)->Pos = joint->Weights[j].StaticPos;
			LocalBuffers[buffer_id]->getVertex(vertex_id)->Normal = joint->Weights[j].StaticNormal;
		}
	}
	SkinnedLastFrame = false;
	LastAnimatedFrame = -1;
}